

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void __thiscall sf::Text::draw(Text *this,RenderTarget *target,RenderStates states)

{
  long lVar1;
  bool bVar2;
  Texture *pTVar3;
  RenderTarget *in_RSI;
  VertexBuffer *in_RDI;
  RenderStates *in_stack_000000b0;
  Drawable *in_stack_000000b8;
  RenderTarget *in_stack_000000c0;
  Text *in_stack_00000100;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  Font *this_00;
  VertexBuffer *vertexBuffer;
  
  this_00 = (Font *)&stack0x00000008;
  lVar1._0_4_ = in_RDI[6].m_primitiveType;
  lVar1._4_4_ = in_RDI[6].m_usage;
  if (lVar1 != 0) {
    ensureGeometryUpdate(in_stack_00000100);
    Transformable::getTransform((Transformable *)states.transform.m_matrix._8_8_);
    operator*=((Transform *)this_00,
               (Transform *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    pTVar3 = Font::getTexture(this_00,in_stack_ffffffffffffffdc);
    vertexBuffer = in_RDI;
    (this_00->m_pages)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pTVar3;
    if (((float)in_RDI[7].m_primitiveType != 0.0) || (NAN((float)in_RDI[7].m_primitiveType))) {
      bVar2 = VertexBuffer::isAvailable();
      if (bVar2) {
        RenderTarget::draw(in_RSI,vertexBuffer,(RenderStates *)this_00);
      }
      else {
        RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
      }
    }
    bVar2 = VertexBuffer::isAvailable();
    if (bVar2) {
      RenderTarget::draw(in_RSI,vertexBuffer,(RenderStates *)this_00);
    }
    else {
      RenderTarget::draw(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
    }
  }
  return;
}

Assistant:

void Text::draw(RenderTarget& target, RenderStates states) const
{
    if (m_font)
    {
        ensureGeometryUpdate();

        states.transform *= getTransform();
        states.texture = &m_font->getTexture(m_characterSize);

        // Only draw the outline if there is something to draw
        if (m_outlineThickness != 0)
        {
            if (VertexBuffer::isAvailable())
            {
                target.draw(m_outlineVerticesBuffer, states);
            }
            else
            {
                target.draw(m_outlineVertices, states);
            }
        }

        if (VertexBuffer::isAvailable())
        {
            target.draw(m_verticesBuffer, states);
        }
        else
        {
            target.draw(m_vertices, states);
        }
    }
}